

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> * __thiscall
crnlib::vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::operator=
          (vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *this,
          vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *other)

{
  uint uVar1;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar2;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *this_00;
  bool bVar3;
  
  if (this != other) {
    if (this->m_capacity < other->m_size) {
      clear(this);
      increase_capacity(this,other->m_size,false,false);
    }
    else {
      resize(this,0,false);
    }
    uVar1 = other->m_size;
    ppVar2 = other->m_p;
    this_00 = this->m_p;
    while (bVar3 = uVar1 != 0, uVar1 = uVar1 - 1, bVar3) {
      std::pair<crnlib::vec<2U,_float>,_unsigned_int>::pair(this_00,ppVar2);
      ppVar2 = ppVar2 + 1;
      this_00 = this_00 + 1;
    }
    this->m_size = other->m_size;
  }
  return this;
}

Assistant:

inline vector& operator=(const vector& other) {
    if (this == &other)
      return *this;

    if (m_capacity >= other.m_size)
      resize(0);
    else {
      clear();
      increase_capacity(other.m_size, false);
    }

    if (CRNLIB_IS_BITWISE_COPYABLE(T))
      memcpy(m_p, other.m_p, other.m_size * sizeof(T));
    else {
      T* pDst = m_p;
      const T* pSrc = other.m_p;
      for (uint i = other.m_size; i > 0; i--)
        helpers::construct(pDst++, *pSrc++);
    }

    m_size = other.m_size;

    return *this;
  }